

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void __thiscall r_exec::AntiFact::~AntiFact(AntiFact *this)

{
  AntiFact *this_local;
  
  ~AntiFact(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT AntiFact:
    public _Fact
{
public:
    void *operator new(size_t s);
    AntiFact();
    AntiFact(r_code::SysObject *source);
    AntiFact(AntiFact *f);
    AntiFact(Code *object, uint64_t after, uint64_t before, double confidence, double psln_thr);
}